

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDrainer.cpp
# Opt level: O0

void __thiscall adios2::burstbuffer::FileDrainer::CloseAll(FileDrainer *this)

{
  bool bVar1;
  FileDrainer *in_RDI;
  iterator it_1;
  iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>_>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20;
  _Self local_18;
  _Self local_10 [2];
  
  local_10[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>_>
                *)in_stack_ffffffffffffffc8);
  while( true ) {
    local_18._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>_>
                *)in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>
                  *)in_RDI);
    Close(in_RDI,(OutputFile *)in_stack_ffffffffffffffc8);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>
                  *)in_RDI);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>_>
  ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>_>
           *)0xacff57);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>_>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>_>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>_>_>
                  *)in_RDI);
    Close(in_RDI,(InputFile *)in_stack_ffffffffffffffc8);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>_>_>
                  *)in_RDI);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>_>_>_>
  ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>_>_>_>
           *)0xacffd0);
  return;
}

Assistant:

void FileDrainer::CloseAll()
{
    for (auto it = m_OutputFileMap.begin(); it != m_OutputFileMap.end(); ++it)
    {
        // if (it->second->good())
        //{
        Close(it->second);
        //}
    }
    m_OutputFileMap.clear();
    for (auto it = m_InputFileMap.begin(); it != m_InputFileMap.end(); ++it)
    {
        // if (it->second->good())
        //{
        Close(it->second);
        //}
    }
    m_InputFileMap.clear();
}